

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

void __thiscall Cleaner::PrintHeader(Cleaner *this)

{
  int __c;
  bool bVar1;
  
  if (*(int *)this->config_ != 0) {
    printf("Cleaning...");
    bVar1 = IsVerbose(this);
    __c = 0x20;
    if (bVar1) {
      __c = 10;
    }
    putchar(__c);
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void Cleaner::PrintHeader() {
  if (config_.verbosity == BuildConfig::QUIET)
    return;
  printf("Cleaning...");
  if (IsVerbose())
    printf("\n");
  else
    printf(" ");
  fflush(stdout);
}